

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::Value(Value *this,ValueType vtype)

{
  char *pcVar1;
  
  *(ushort *)&this->field_0x8 =
       (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | (ushort)vtype & 0xff;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = 0;
  this->limit_ = 0;
  switch(vtype) {
  case nullValue:
    break;
  case intValue:
  case uintValue:
  case realValue:
    (this->value_).int_ = 0;
    break;
  case stringValue:
    pcVar1 = "";
    goto LAB_003f7933;
  case booleanValue:
    (this->value_).bool_ = false;
    break;
  case arrayValue:
  case objectValue:
    pcVar1 = (char *)operator_new(0x30);
    pcVar1[0x10] = '\0';
    pcVar1[0x11] = '\0';
    pcVar1[0x12] = '\0';
    pcVar1[0x13] = '\0';
    pcVar1[0x14] = '\0';
    pcVar1[0x15] = '\0';
    pcVar1[0x16] = '\0';
    pcVar1[0x17] = '\0';
    pcVar1[0x18] = '\0';
    pcVar1[0x19] = '\0';
    pcVar1[0x1a] = '\0';
    pcVar1[0x1b] = '\0';
    pcVar1[0x1c] = '\0';
    pcVar1[0x1d] = '\0';
    pcVar1[0x1e] = '\0';
    pcVar1[0x1f] = '\0';
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = '\0';
    pcVar1[0xd] = '\0';
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
    *(char **)(pcVar1 + 0x18) = pcVar1 + 8;
    *(char **)(pcVar1 + 0x20) = pcVar1 + 8;
    pcVar1[0x28] = '\0';
    pcVar1[0x29] = '\0';
    pcVar1[0x2a] = '\0';
    pcVar1[0x2b] = '\0';
    pcVar1[0x2c] = '\0';
    pcVar1[0x2d] = '\0';
    pcVar1[0x2e] = '\0';
    pcVar1[0x2f] = '\0';
LAB_003f7933:
    (this->value_).string_ = pcVar1;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x17c,"Json::Value::Value(ValueType)");
  }
  return;
}

Assistant:

void Value::initBasic(ValueType vtype, bool allocated) {
  type_ = vtype;
  allocated_ = allocated;
  comments_ = 0;
  start_ = 0;
  limit_ = 0;
}